

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack29_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6 = *(undefined1 (*) [16])(in + 1);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  uVar3 = *(ulong *)(in + 5);
  *out = uVar1 & 0x1fffffff;
  uVar2 = in[7];
  auVar4 = vpermi2d_avx512vl(auVar5,auVar6,ZEXT416(uVar1));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar5 = vpalignr_avx(auVar7,auVar6,0xc);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_0019ca90);
  auVar4 = vpshldvd_avx512_vbmi2(auVar6,auVar4,_DAT_00190a30);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_0019c760);
  auVar5._8_4_ = 0x1fffffff;
  auVar5._0_8_ = 0x1fffffff1fffffff;
  auVar5._12_4_ = 0x1fffffff;
  auVar5 = vpandd_avx512vl(auVar4,auVar5);
  auVar4._8_4_ = 0x1fff8000;
  auVar4._0_8_ = 0x1ffc00001fff8000;
  auVar4._12_4_ = 0x1ffc0000;
  auVar6 = vpternlogq_avx512vl(auVar7,auVar6,auVar4,0xec);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  *(long *)(out + 5) = auVar6._0_8_;
  out[7] = (uVar2 & 0xff) << 0x15 | (uint)(uVar3 >> 0x2b);
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack29_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;

  return in + 1;
}